

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O2

void __thiscall
BinaryEqualFailure::BinaryEqualFailure
          (BinaryEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          uchar *expected,uchar *actual,size_t size,SimpleString *text)

{
  SimpleString *this_00;
  long lVar1;
  long lVar2;
  size_t reportedPosition;
  SimpleString *pSVar3;
  long lVar4;
  SimpleString actualHex;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_003aac40;
  TestFailure::createUserText((TestFailure *)&actualHex,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,&actualHex);
  SimpleString::~SimpleString(&actualHex);
  StringFromBinaryOrNull((uchar *)&actualHex,(size_t)actual);
  pSVar3 = (SimpleString *)expected;
  StringFromBinaryOrNull(&stack0xffffffffffffffc8,(size_t)expected);
  TestFailure::createButWasString
            ((TestFailure *)&stack0xffffffffffffffb8,pSVar3,(SimpleString *)&stack0xffffffffffffffc8
            );
  pSVar3 = (SimpleString *)&stack0xffffffffffffffb8;
  SimpleString::operator+=(this_00,pSVar3);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  if (actual != (uchar *)0x0 && expected != (uchar *)0x0) {
    reportedPosition = 0xfffffffffffffffe;
    lVar4 = -1;
    do {
      lVar1 = lVar4 + 1;
      reportedPosition = reportedPosition + 3;
      lVar2 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (actual[lVar1] == expected[lVar2]);
    TestFailure::createDifferenceAtPosString
              ((TestFailure *)&stack0xffffffffffffffb8,pSVar3,(size_t)&actualHex,reportedPosition);
    SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffb8);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  }
  SimpleString::~SimpleString(&actualHex);
  return;
}

Assistant:

BinaryEqualFailure::BinaryEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const unsigned char* expected,
                                       const unsigned char* actual, size_t size, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString actualHex = StringFromBinaryOrNull(actual, size);

	message_ += createButWasString(StringFromBinaryOrNull(expected, size), actualHex);
	if ((expected) && (actual))
	{
		size_t failStart;
		for (failStart = 0; actual[failStart] == expected[failStart]; failStart++)
			;
		message_ += createDifferenceAtPosString(actualHex, (failStart * 3 + 1), failStart);
	}
}